

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_state.cpp
# Opt level: O0

node_ids_t * __thiscall
libtorrent::dht::extract_node_ids
          (node_ids_t *__return_storage_ptr__,dht *this,bdecode_node *e,string_view key)

{
  string_view key_00;
  undefined4 uVar1;
  bool bVar2;
  type_t tVar3;
  int iVar4;
  size_type sVar5;
  difference_type dVar6;
  char **in_00;
  string_view sVar7;
  address_v6 local_1c0;
  address_v4 local_1a4;
  undefined1 local_1a0 [8];
  address addr;
  node_id id;
  char *in;
  bdecode_node nid;
  int i;
  undefined1 local_108 [8];
  bdecode_node nids;
  span<const_char> local_c0;
  digest32<160L> local_ac;
  address local_98;
  string_view local_68;
  bdecode_node *local_58;
  char *pcStack_50;
  undefined1 local_40 [8];
  string_view old_nid;
  bdecode_node *e_local;
  string_view key_local;
  node_ids_t *ret;
  
  tVar3 = bdecode_node::type((bdecode_node *)this);
  if (tVar3 == dict_t) {
    old_nid._M_str._7_1_ = 0;
    ::std::
    vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    ::vector(__return_storage_ptr__);
    local_58 = e;
    pcStack_50 = (char *)key._M_len;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68);
    sVar7._M_str = pcStack_50;
    sVar7._M_len = (size_t)local_58;
    sVar7 = bdecode_node::dict_find_string_value((bdecode_node *)this,sVar7,local_68);
    old_nid._M_len = (size_t)sVar7._M_str;
    local_40 = (undefined1  [8])sVar7._M_len;
    sVar5 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    if (sVar5 == 0x14) {
      boost::asio::ip::address::address(&local_98);
      span<char_const>::span<std::basic_string_view<char,std::char_traits<char>>,char_const,void>
                ((span<char_const> *)&local_c0,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_40);
      digest32<160L>::digest32(&local_ac,local_c0);
      ::std::
      vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
      ::emplace_back<boost::asio::ip::address,libtorrent::digest32<160l>>
                ((vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
                  *)__return_storage_ptr__,&local_98,&local_ac);
      old_nid._M_str._7_1_ = 1;
      nids._60_4_ = 1;
    }
    else {
      key_00._M_str = (char *)key._M_len;
      key_00._M_len = (size_t)e;
      bdecode_node::dict_find_list((bdecode_node *)local_108,(bdecode_node *)this,key_00);
      bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_108);
      if (bVar2) {
        for (nid._60_4_ = 0; uVar1 = nid._60_4_,
            iVar4 = bdecode_node::list_size((bdecode_node *)local_108), (int)uVar1 < iVar4;
            nid._60_4_ = nid._60_4_ + 1) {
          bdecode_node::list_at((bdecode_node *)&in,(bdecode_node *)local_108,nid._60_4_);
          tVar3 = bdecode_node::type((bdecode_node *)&in);
          if (tVar3 == string_t) {
            iVar4 = bdecode_node::string_length((bdecode_node *)&in);
            if (iVar4 < 0x14) {
              nids._60_4_ = 4;
            }
            else {
              id.m_number._M_elems._12_8_ = bdecode_node::string_ptr((bdecode_node *)&in);
              digest32<160L>::digest32
                        ((digest32<160L> *)((long)&addr.ipv6_address_.scope_id_ + 4),
                         (char *)id.m_number._M_elems._12_8_);
              dVar6 = digest32<160L>::size();
              id.m_number._M_elems._12_8_ = id.m_number._M_elems._12_8_ + dVar6;
              boost::asio::ip::address::address((address *)local_1a0);
              iVar4 = bdecode_node::string_length((bdecode_node *)&in);
              if (iVar4 == 0x18) {
                libtorrent::aux::read_v4_address<char_const*&>
                          ((aux *)&local_1a4,(char **)(id.m_number._M_elems + 3));
                boost::asio::ip::address::operator=((address *)local_1a0,&local_1a4);
              }
              else {
                iVar4 = bdecode_node::string_length((bdecode_node *)&in);
                if (iVar4 != 0x24) {
                  nids._60_4_ = 4;
                  goto LAB_007dfb2e;
                }
                libtorrent::aux::read_v6_address<char_const*&>
                          (&local_1c0,(aux *)(id.m_number._M_elems + 3),in_00);
                boost::asio::ip::address::operator=((address *)local_1a0,&local_1c0);
              }
              ::std::
              vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
              ::emplace_back<boost::asio::ip::address&,libtorrent::digest32<160l>&>
                        ((vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
                          *)__return_storage_ptr__,(address *)local_1a0,
                         (digest32<160L> *)((long)&addr.ipv6_address_.scope_id_ + 4));
              nids._60_4_ = 0;
            }
          }
          else {
            nids._60_4_ = 4;
          }
LAB_007dfb2e:
          bdecode_node::~bdecode_node((bdecode_node *)&in);
        }
      }
      old_nid._M_str._7_1_ = 1;
      nids._60_4_ = 1;
      bdecode_node::~bdecode_node((bdecode_node *)local_108);
    }
    if ((old_nid._M_str._7_1_ & 1) == 0) {
      ::std::
      vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
      ::~vector(__return_storage_ptr__);
    }
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    ::std::
    vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

node_ids_t extract_node_ids(bdecode_node const& e, string_view key)
	{
		if (e.type() != bdecode_node::dict_t) return node_ids_t();
		node_ids_t ret;
		// first look for an old-style nid
		auto const old_nid = e.dict_find_string_value(key);
		if (old_nid.size() == 20)
		{
			ret.emplace_back(address(), node_id(old_nid));
			return ret;
		}
		auto const nids = e.dict_find_list(key);
		if (!nids) return ret;
		for (int i = 0; i < nids.list_size(); i++)
		{
			bdecode_node nid = nids.list_at(i);
			if (nid.type() != bdecode_node::string_t) continue;
			if (nid.string_length() < 20) continue;
			char const* in = nid.string_ptr();
			node_id id(in);
			in += id.size();
			address addr;
			if (nid.string_length() == 24)
				addr = aux::read_v4_address(in);
			else if (nid.string_length() == 36)
				addr = aux::read_v6_address(in);
			else
				continue;
			ret.emplace_back(addr, id);
		}

		return ret;
	}